

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

int ndn_signature_info_tlv_encode(ndn_encoder_t *encoder,ndn_signature_t *signature)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t validity_period_buffer_size;
  uint32_t key_name_block_size;
  uint32_t info_buffer_size;
  int ret_val;
  ndn_signature_t *signature_local;
  ndn_encoder_t *encoder_local;
  
  validity_period_buffer_size = encoder_probe_block_size(0x1b,1);
  local_2c = 0;
  local_30 = 0;
  if (signature->enable_KeyLocator != '\0') {
    local_2c = ndn_name_probe_block_size(&signature->key_locator_name);
    uVar1 = encoder_probe_block_size(0x1c,local_2c);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_ValidityPeriod != '\0') {
    uVar1 = encoder_probe_block_size(0xfe,0xf);
    local_30 = encoder_probe_block_size(0xff,0xf);
    local_30 = local_30 + uVar1;
    uVar1 = encoder_probe_block_size(0xfd,local_30);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_SignatureNonce != '\0') {
    uVar1 = encoder_probe_block_size(10,4);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_Timestamp != '\0') {
    uVar1 = encoder_probe_uint_length(signature->timestamp);
    uVar1 = encoder_probe_block_size(0x28,uVar1);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if (signature->enable_Seqnum != '\0') {
    uVar1 = encoder_probe_uint_length(signature->seqnum);
    uVar1 = encoder_probe_block_size(0x2a,uVar1);
    validity_period_buffer_size = uVar1 + validity_period_buffer_size;
  }
  if ((signature->is_interest & 1U) == 0) {
    key_name_block_size = encoder_append_type(encoder,0x16);
  }
  else {
    key_name_block_size = encoder_append_type(encoder,0x2c);
  }
  if (key_name_block_size == 0) {
    encoder_local._4_4_ = encoder_append_length(encoder,validity_period_buffer_size);
    if ((((((encoder_local._4_4_ == 0) &&
           (encoder_local._4_4_ = encoder_append_type(encoder,0x1b), encoder_local._4_4_ == 0)) &&
          (encoder_local._4_4_ = encoder_append_length(encoder,1), encoder_local._4_4_ == 0)) &&
         (encoder_local._4_4_ = encoder_append_byte_value(encoder,signature->sig_type),
         encoder_local._4_4_ == 0)) &&
        ((signature->enable_KeyLocator == '\0' ||
         (((encoder_local._4_4_ = encoder_append_type(encoder,0x1c), encoder_local._4_4_ == 0 &&
           (encoder_local._4_4_ = encoder_append_length(encoder,local_2c), encoder_local._4_4_ == 0)
           ) && (encoder_local._4_4_ = ndn_name_tlv_encode(encoder,&signature->key_locator_name),
                encoder_local._4_4_ == 0)))))) &&
       ((signature->enable_SignatureNonce == '\0' ||
        (((encoder_local._4_4_ = encoder_append_type(encoder,10), encoder_local._4_4_ == 0 &&
          (encoder_local._4_4_ = encoder_append_length(encoder,4), encoder_local._4_4_ == 0)) &&
         (encoder_local._4_4_ = encoder_append_uint32_value(encoder,signature->signature_nonce),
         encoder_local._4_4_ == 0)))))) {
      if (signature->enable_Timestamp != '\0') {
        iVar2 = encoder_append_type(encoder,0x28);
        if (iVar2 != 0) {
          return iVar2;
        }
        uVar1 = encoder_probe_uint_length(signature->timestamp);
        iVar2 = encoder_append_length(encoder,uVar1);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = encoder_append_uint_value(encoder,signature->timestamp);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      if (signature->enable_Seqnum != '\0') {
        iVar2 = encoder_append_type(encoder,0x2a);
        if (iVar2 != 0) {
          return iVar2;
        }
        uVar1 = encoder_probe_uint_length(signature->seqnum);
        iVar2 = encoder_append_length(encoder,uVar1);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = encoder_append_uint_value(encoder,signature->seqnum);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      if ((signature->enable_ValidityPeriod == '\0') ||
         (((((encoder_local._4_4_ = encoder_append_type(encoder,0xfd), encoder_local._4_4_ == 0 &&
             (encoder_local._4_4_ = encoder_append_length(encoder,local_30),
             encoder_local._4_4_ == 0)) &&
            (encoder_local._4_4_ = encoder_append_type(encoder,0xfe), encoder_local._4_4_ == 0)) &&
           ((encoder_local._4_4_ = encoder_append_length(encoder,0xf), encoder_local._4_4_ == 0 &&
            (encoder_local._4_4_ =
                  encoder_append_raw_buffer_value
                            (encoder,(signature->validity_period).not_before,0xf),
            encoder_local._4_4_ == 0)))) &&
          ((encoder_local._4_4_ = encoder_append_type(encoder,0xff), encoder_local._4_4_ == 0 &&
           ((encoder_local._4_4_ = encoder_append_length(encoder,0xf), encoder_local._4_4_ == 0 &&
            (encoder_local._4_4_ =
                  encoder_append_raw_buffer_value
                            (encoder,(signature->validity_period).not_after,0xf),
            encoder_local._4_4_ == 0)))))))) {
        encoder_local._4_4_ = 0;
      }
    }
  }
  else {
    encoder_local._4_4_ = key_name_block_size;
  }
  return encoder_local._4_4_;
}

Assistant:

int
ndn_signature_info_tlv_encode(ndn_encoder_t* encoder, const ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t info_buffer_size = encoder_probe_block_size(TLV_SignatureType, 1);
  uint32_t key_name_block_size = 0;
  uint32_t validity_period_buffer_size = 0;

  if (signature->enable_KeyLocator > 0) {
    key_name_block_size = ndn_name_probe_block_size(&signature->key_locator_name);
    info_buffer_size += encoder_probe_block_size(TLV_KeyLocator, key_name_block_size);
  }
  if (signature->enable_ValidityPeriod > 0) {
    validity_period_buffer_size = encoder_probe_block_size(TLV_NotBefore, 15);
    validity_period_buffer_size += encoder_probe_block_size(TLV_NotAfter, 15);
    info_buffer_size += encoder_probe_block_size(TLV_ValidityPeriod, validity_period_buffer_size);
  }
  if (signature->enable_SignatureNonce > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Nonce, 4);
  }
  if (signature->enable_Timestamp > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Timestamp,
                                                 encoder_probe_uint_length(signature->timestamp));
  }
  if (signature->enable_Seqnum > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SeqNum,
                                                 encoder_probe_uint_length(signature->seqnum));
  }

  // signatureinfo header
  if (signature->is_interest) {
    ret_val = encoder_append_type(encoder, TLV_InterestSignatureInfo);
  }
  else {
    ret_val = encoder_append_type(encoder, TLV_SignatureInfo);
  }
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, info_buffer_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // signature type
  ret_val = encoder_append_type(encoder, TLV_SignatureType);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, 1);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_byte_value(encoder, signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // key locator
  if (signature->enable_KeyLocator) {
    ret_val = encoder_append_type(encoder, TLV_KeyLocator);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, key_name_block_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_name_tlv_encode(encoder, &signature->key_locator_name);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // signature nonce
  if (signature->enable_SignatureNonce > 0) {
    ret_val = encoder_append_type(encoder, TLV_Nonce);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 4);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint32_value(encoder, signature->signature_nonce);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // timestamp
  if (signature->enable_Timestamp > 0) {
    ret_val = encoder_append_type(encoder, TLV_Timestamp);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(signature->timestamp));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, signature->timestamp);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // timestamp
  if (signature->enable_Seqnum > 0) {
    ret_val = encoder_append_type(encoder, TLV_SeqNum);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(signature->seqnum));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, signature->seqnum);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }

  // validity period
  if (signature->enable_ValidityPeriod) {
    ret_val = encoder_append_type(encoder, TLV_ValidityPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, validity_period_buffer_size);
    if (ret_val != NDN_SUCCESS) return ret_val;

    ret_val = encoder_append_type(encoder, TLV_NotBefore);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(encoder, signature->validity_period.not_before, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;

    ret_val = encoder_append_type(encoder, TLV_NotAfter);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(encoder, signature->validity_period.not_after, 15);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}